

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

type_conflict2
jsoncons::detail::from_integer<int,jsoncons::string_sink<std::__cxx11::wstring>>
          (int value,
          string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *result)

{
  int iVar1;
  int iVar2;
  string *s;
  int *piVar3;
  undefined8 in_RSI;
  int in_EDI;
  size_t count;
  bool is_negative;
  char_type *last;
  char_type *p;
  char_type buf [255];
  undefined8 in_stack_fffffffffffffb78;
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *in_stack_fffffffffffffb80;
  assertion_error *this;
  bool local_472;
  bool local_471;
  type_conflict2 local_470;
  allocator<char> *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  int *local_420;
  int local_418 [255];
  int aiStack_1c [6];
  int local_4;
  
  local_420 = local_418;
  iVar2 = in_EDI;
  if (in_EDI < 0) {
    do {
      local_4 = iVar2;
      piVar3 = local_420 + 1;
      *local_420 = 0x30 - local_4 % 10;
      iVar2 = local_4 / 10;
      local_471 = iVar2 != 0 && piVar3 < aiStack_1c;
      local_420 = piVar3;
      iVar1 = local_4;
    } while (local_471);
  }
  else {
    do {
      local_4 = iVar2;
      piVar3 = local_420 + 1;
      *local_420 = local_4 % 10 + 0x30;
      iVar2 = local_4 / 10;
      local_472 = iVar2 != 0 && piVar3 < aiStack_1c;
      local_420 = piVar3;
      iVar1 = local_4;
    } while (local_472);
  }
  local_4 = iVar2;
  if (local_420 == aiStack_1c) {
    s = (string *)__cxa_allocate_exception(0x10,in_RSI,(long)iVar1 % 10 & 0xffffffff);
    this = (assertion_error *)&stack0xfffffffffffffbaf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    assertion_error::assertion_error(this,s);
    __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  local_470 = (long)local_420 - (long)local_418 >> 2;
  if (in_EDI < 0) {
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::push_back(in_stack_fffffffffffffb80,(value_type)((ulong)in_stack_fffffffffffffb78 >> 0x20));
    local_470 = local_470 + 1;
  }
  while (local_420 = local_420 + -1, local_418 <= local_420) {
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::push_back(in_stack_fffffffffffffb80,(value_type)((ulong)in_stack_fffffffffffffb78 >> 0x20));
  }
  return local_470;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }